

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

bool glcts::verifyResultImage<float,1u,3u,3u>
               (GLuint n_mipmap_levels,GLuint n_layers,
               _func_void_GLuint_GLint_GLint_GLint_GLint_float_ptr *getComponents,GLubyte *data)

{
  bool bVar1;
  long lVar2;
  GLuint pixel;
  long lVar3;
  GLuint layer;
  GLuint GVar4;
  GLuint face;
  int iVar5;
  float components [1];
  vector<float,_std::allocator<float>_> expected_values;
  float local_5c;
  float *local_58;
  long local_50;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (float *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = (float *)data;
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)&local_48,(ulong)(n_layers * 0x36));
  lVar2 = 0;
  for (GVar4 = 0; GVar4 != n_layers; GVar4 = GVar4 + 1) {
    local_50 = lVar2;
    for (iVar5 = 0; iVar5 != 6; iVar5 = iVar5 + 1) {
      for (lVar3 = 0; lVar3 != 9; lVar3 = lVar3 + 1) {
        (*getComponents)((GLuint)lVar3,iVar5,GVar4,n_layers,n_mipmap_levels,&local_5c);
        local_48._M_impl.super__Vector_impl_data._M_start[(int)lVar2 + (GLuint)lVar3] = local_5c;
      }
      lVar2 = lVar2 + 9;
    }
    lVar2 = local_50 + 0x36;
  }
  bVar1 = verifyImage<float,1u,3u,3u>
                    (local_58,local_48._M_impl.super__Vector_impl_data._M_start,n_layers);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  return bVar1;
}

Assistant:

bool verifyResultImage(glw::GLuint n_mipmap_levels, glw::GLuint n_layers,
					   void (*getComponents)(glw::GLuint pixel_index, glw::GLint cube_face, glw::GLint layer_index,
											 glw::GLint n_layers, glw::GLint n_mipmap_levels, T* out_components),
					   const glw::GLubyte* data)
{
	const glw::GLuint n_components			= N_Components;
	const glw::GLuint face_width			= Width;
	const glw::GLuint face_height			= Height;
	const glw::GLuint n_pixels_per_face		= face_width * face_height;
	const glw::GLuint n_components_per_face = n_pixels_per_face * n_components;
	const glw::GLuint n_faces				= 6;
	const glw::GLuint n_total_faces			= n_layers * n_faces;
	const glw::GLuint n_total_components	= n_total_faces * n_components_per_face;
	const T*		  result_image			= (const T*)data;

	std::vector<T> expected_values;
	expected_values.resize(n_total_components);

	for (glw::GLuint layer = 0; layer < n_layers; ++layer)
	{
		const glw::GLuint layer_offset = layer * n_faces * n_components_per_face;

		for (glw::GLuint face = 0; face < n_faces; ++face)
		{
			const glw::GLuint face_offset = face * n_components_per_face + layer_offset;

			for (glw::GLuint pixel = 0; pixel < n_pixels_per_face; ++pixel)
			{
				const glw::GLuint pixel_offset = pixel * n_components + face_offset;

				T components[n_components];

				getComponents(pixel, face, layer, n_layers, n_mipmap_levels, components);

				for (glw::GLuint component = 0; component < n_components; ++component)
				{
					const glw::GLuint component_offset = pixel_offset + component;

					expected_values[component_offset] = components[component];
				}
			}
		}
	}

	return verifyImage<T, N_Components, Width, Height>(result_image, &expected_values[0], n_layers);
}